

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void ctemplate::AppendTokenWithIndent
               (int level,string *out,string *before,TemplateToken *token,string *after)

{
  char *pcVar1;
  ulong uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [39];
  allocator local_89;
  string local_88 [8];
  string token_string;
  allocator local_51;
  string local_50 [32];
  string *local_30;
  string *after_local;
  TemplateToken *token_local;
  string *before_local;
  string *out_local;
  int level_local;
  
  local_30 = after;
  after_local = (string *)token;
  token_local = (TemplateToken *)before;
  before_local = out;
  out_local._4_4_ = level;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(long)(level * 2),' ',&local_51);
  std::__cxx11::string::append((string *)out);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar1 = *(char **)(after_local + 8);
  uVar2 = *(ulong *)(after_local + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,uVar2,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  psVar3 = before_local;
  std::operator+(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          token_local);
  std::operator+(local_b0,local_d0);
  std::__cxx11::string::append((string *)psVar3);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

static void AppendTokenWithIndent(int level, string *out, const string& before,
                                  const TemplateToken& token,
                                  const string& after) {
  out->append(string(level * kIndent, ' '));
  string token_string(token.text, token.textlen);
  out->append(before + token_string + after);
}